

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_prepro.h
# Opt level: O2

void __thiscall
mp::
ConstraintPreprocessors<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>>
::
PreprocessConstraint<mp::PreprocessInfo<mp::ConditionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,mp::AlgConRhs<_1>>>>,mp::LinTerms,_1>
          (ConstraintPreprocessors<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>>
           *this,ConditionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_>_>
                 *cc,
          PreprocessInfo<mp::ConditionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_>_>_>
          *prepro)

{
  CustomConstraintData<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_>,_std::array<int,_0UL>,_mp::CondConId<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_>_>_>
  *this_00;
  double __x;
  int iVar1;
  bool bVar2;
  Var VVar3;
  ConType *arg;
  ulong uVar4;
  ulong uVar5;
  double dVar6;
  double dVar7;
  PreprocessInfoStd bnt;
  LinTerms local_1e0;
  AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_> local_168;
  Arguments arg1;
  
  bVar2 = CheckEmptySubCon<mp::AlgebraicConstraint<mp::LinTerms,mp::AlgConRhs<_1>>,mp::PreprocessInfo<mp::ConditionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,mp::AlgConRhs<_1>>>>>
                    (this,cc,prepro);
  if (!bVar2) {
    uVar4 = -(ulong)(1.0 < prepro->ub_);
    prepro->lb_ = (double)(~-(ulong)(prepro->lb_ < 0.0) & (ulong)prepro->lb_);
    prepro->ub_ = (double)(~uVar4 & (ulong)prepro->ub_ | uVar4 & 0x3ff0000000000000);
    prepro->type_ = INTEGER;
    this_00 = &(cc->
               super_CustomFunctionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_>,_std::array<int,_0UL>,_mp::LogicalFunctionalConstraintTraits,_mp::CondConId<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_>_>_>
               ).
               super_CustomConstraintData<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_>,_std::array<int,_0UL>,_mp::CondConId<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_>_>_>
    ;
    bVar2 = AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<-1>_>::is_normalized(&this_00->args_);
    if (bVar2) {
      __x = (cc->
            super_CustomFunctionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_>,_std::array<int,_0UL>,_mp::LogicalFunctionalConstraintTraits,_mp::CondConId<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_>_>_>
            ).
            super_CustomConstraintData<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_>,_std::array<int,_0UL>,_mp::CondConId<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_>_>_>
            .args_.super_AlgConRhs<_1>.rhs_;
      BoundComputations<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
      ::ComputeBoundsAndType
                (&bnt,(BoundComputations<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                       *)this,
                 &(cc->
                  super_CustomFunctionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_>,_std::array<int,_0UL>,_mp::LogicalFunctionalConstraintTraits,_mp::CondConId<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_>_>_>
                  ).
                  super_CustomConstraintData<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_>,_std::array<int,_0UL>,_mp::CondConId<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_>_>_>
                  .args_.super_LinTerms);
      iVar1 = *(int *)(this + 0x2e8);
      if (((*(int *)(this + 0x2f4) != 0) && (iVar1 != 0)) && (bnt.type_ == INTEGER)) {
        dVar6 = floor(__x);
        dVar7 = ceil(__x);
        if ((dVar6 != dVar7) || (NAN(dVar6) || NAN(dVar7))) {
          (cc->
          super_CustomFunctionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_>,_std::array<int,_0UL>,_mp::LogicalFunctionalConstraintTraits,_mp::CondConId<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_>_>_>
          ).
          super_CustomConstraintData<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_>,_std::array<int,_0UL>,_mp::CondConId<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_>_>_>
          .args_.super_AlgConRhs<_1>.rhs_ = dVar6;
        }
      }
      if ((iVar1 != 0) && (*(int *)(this + 0x2f8) != 0)) {
        if (bnt.ub_ <= __x) {
          dVar6 = 1.0;
        }
        else {
          dVar6 = 0.0;
          if (bnt.lb_ <= __x) {
            return;
          }
        }
        uVar4 = -(ulong)(prepro->lb_ < dVar6);
        uVar5 = -(ulong)(dVar6 < prepro->ub_);
        prepro->lb_ = (double)(~uVar4 & (ulong)prepro->lb_ | (ulong)dVar6 & uVar4);
        prepro->ub_ = (double)(~uVar5 & (ulong)prepro->ub_ | (ulong)dVar6 & uVar5);
      }
    }
    else {
      AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<-1>_>::AlgebraicConstraint
                (&arg1,&this_00->args_);
      AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<-1>_>::negate(&arg1);
      LinTerms::LinTerms(&local_1e0,&arg1.super_LinTerms);
      AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>::AlgebraicConstraint
                (&local_168,&local_1e0,(AlgConRhs<1>)arg1.super_AlgConRhs<_1>.rhs_,true);
      ConditionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>_>::
      ConditionalConstraint
                ((ConditionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>_> *
                 )&bnt,&local_168);
      VVar3 = FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>
              ::
              AssignResultVar2Args<mp::ConditionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,mp::AlgConRhs<1>>>>
                        ((FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>
                          *)this,(ConditionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>_>
                                  *)&bnt);
      prepro->result_var_ = VVar3;
      CustomFunctionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>,_std::array<int,_0UL>,_mp::LogicalFunctionalConstraintTraits,_mp::CondConId<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>_>_>
      ::~CustomFunctionalConstraint
                ((CustomFunctionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>,_std::array<int,_0UL>,_mp::LogicalFunctionalConstraintTraits,_mp::CondConId<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>_>_>
                  *)&bnt);
      AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>::~AlgebraicConstraint(&local_168);
      LinTerms::~LinTerms(&local_1e0);
      AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<-1>_>::~AlgebraicConstraint(&arg1);
    }
  }
  return;
}

Assistant:

void PreprocessConstraint(
      ConditionalConstraint<
        AlgebraicConstraint< Body, AlgConRhs<kind> > >& cc,
      PreprocessInfo& prepro) {
    if (CheckEmptySubCon(cc, prepro))
      return;
    prepro.narrow_result_bounds(0.0, 1.0);
    prepro.set_result_type( var::INTEGER );
    assert(kind);
    auto& algc = cc.GetArguments();
    if (!IsNormalized(cc)) {
      auto arg1 = algc; // Add the normalized one instead
      arg1.negate();    // Negate the terms and sense
      prepro.set_result_var(
            MPD( AssignResultVar2Args(
                   ConditionalConstraint<
                     AlgebraicConstraint< Body, AlgConRhs<
                   -kind> > > { {
                   std::move(arg1.GetBody()), arg1.rhs()
                 } } ) ));
      return;
    }
    // See if we need to round the constant term
    auto rhs = algc.rhs();
    auto bnt = MPD(
          ComputeBoundsAndType(algc.GetBody()) );
    if (MPCD( IfPreproIneqRHS() )
        && var::INTEGER == bnt.get_result_type()
        && std::floor(rhs) != std::ceil(rhs)) {  // rhs not int
      if (1==kind)  // algc is >=
        algc.set_rhs( std::ceil(rhs) );
      else if (-1==kind)
        algc.set_rhs( std::floor(rhs) );
      else if (2==kind)  // algc is >
        algc.set_rhs( std::floor(rhs) ); // > floor(rhs)
      else {
        assert(-2==kind);
        algc.set_rhs( std::ceil(rhs) );
      }
    }
    // Decidable cases
    if (MPCD( IfPreproIneqResBounds() )) {
      if ((1==kind && bnt.lb()>=rhs)
          || (-1==kind && bnt.ub()<=rhs)
          || (2==kind && bnt.lb()>rhs)
          || (-2==kind && bnt.ub()<rhs)) {
        prepro.narrow_result_bounds(1.0, 1.0);   // TRUE
      } else {
        if ((1==kind && bnt.ub()<rhs)
            || (-1==kind && bnt.lb()>rhs)
            || (2==kind && bnt.ub()<=rhs)
            || (-2==kind && bnt.lb()>=rhs)) {
          prepro.narrow_result_bounds(0.0, 0.0);   // FALSE
        }
      }
    }
  }